

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printLevelIndex(ktxLevelIndexEntry *levelIndex,ktx_uint32_t numLevels)

{
  uint in_ESI;
  long in_RDI;
  ktx_uint32_t level;
  uint local_14;
  uint local_10;
  
  local_14 = in_ESI;
  if (0x40 < in_ESI) {
    local_14 = 0x40;
  }
  for (local_10 = 0; local_10 < local_14; local_10 = local_10 + 1) {
    fprintf(_stdout,"Level%u.byteOffset: %#lx\n",(ulong)local_10,
            *(undefined8 *)(in_RDI + (ulong)local_10 * 0x18));
    fprintf(_stdout,"Level%u.byteLength: %ld\n",(ulong)local_10,
            *(undefined8 *)(in_RDI + (ulong)local_10 * 0x18 + 8));
    fprintf(_stdout,"Level%u.uncompressedByteLength: %ld\n",(ulong)local_10,
            *(undefined8 *)(in_RDI + (ulong)local_10 * 0x18 + 0x10));
  }
  return;
}

Assistant:

void
printLevelIndex(ktxLevelIndexEntry levelIndex[], ktx_uint32_t numLevels)
{
    numLevels = MIN(MAX_NUM_LEVELS, numLevels); // Print at most 64 levels to stop parsing garbage
    for (ktx_uint32_t level = 0; level < numLevels; level++) {
    fprintf(stdout, "Level%u.byteOffset: %#" PRIx64 "\n", level,
            levelIndex[level].byteOffset);
    fprintf(stdout, "Level%u.byteLength: %" PRId64 "\n", level,
            levelIndex[level].byteLength);
    fprintf(stdout, "Level%u.uncompressedByteLength: %" PRId64 "\n", level,
            levelIndex[level].uncompressedByteLength);
    }
}